

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int ProcessMetadata(BrotliEncoderState *s,size_t *available_in,uint8_t **next_in,
                   size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  int iVar1;
  size_t sVar2;
  uint local_74;
  ulong local_70;
  uint32_t copy_1;
  uint32_t copy;
  int result;
  size_t *total_out_local;
  uint8_t **next_out_local;
  size_t *available_out_local;
  uint8_t **next_in_local;
  size_t *available_in_local;
  BrotliEncoderState *s_local;
  
  if (*available_in < 0x1000001) {
    if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
      s->remaining_metadata_bytes_ = (uint32_t)*available_in;
      s->stream_state_ = BROTLI_STREAM_METADATA_HEAD;
    }
    if ((s->stream_state_ == BROTLI_STREAM_METADATA_HEAD) ||
       (s->stream_state_ == BROTLI_STREAM_METADATA_BODY)) {
      do {
        while( true ) {
          do {
            iVar1 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
          } while (iVar1 != 0);
          if (s->available_out_ != 0) {
            return 1;
          }
          if (s->input_pos_ != s->last_flush_pos_) break;
          if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD) {
            s->next_out_ = (uint8_t *)&s->tiny_buf_;
            sVar2 = WriteMetadataHeader(s,(ulong)s->remaining_metadata_bytes_,s->next_out_);
            s->available_out_ = sVar2;
            s->stream_state_ = BROTLI_STREAM_METADATA_BODY;
          }
          else {
            if (s->remaining_metadata_bytes_ == 0) {
              s->remaining_metadata_bytes_ = 0xffffffff;
              s->stream_state_ = BROTLI_STREAM_PROCESSING;
              return 1;
            }
            if (*available_out == 0) {
              local_74 = s->remaining_metadata_bytes_;
              if (0xf < local_74) {
                local_74 = 0x10;
              }
              s->next_out_ = (uint8_t *)&s->tiny_buf_;
              memcpy(s->next_out_,*next_in,(ulong)local_74);
              *next_in = *next_in + local_74;
              *available_in = *available_in - (ulong)local_74;
              s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - local_74;
              s->available_out_ = (ulong)local_74;
            }
            else {
              local_70 = *available_out;
              if (s->remaining_metadata_bytes_ < local_70) {
                local_70 = (ulong)s->remaining_metadata_bytes_;
              }
              memcpy(*next_out,*next_in,local_70 & 0xffffffff);
              *next_in = *next_in + (local_70 & 0xffffffff);
              *available_in = *available_in - (local_70 & 0xffffffff);
              s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - (int)local_70;
              *next_out = *next_out + (local_70 & 0xffffffff);
              *available_out = *available_out - (local_70 & 0xffffffff);
            }
          }
        }
        iVar1 = EncodeData(s,0,1,&s->available_out_,&s->next_out_);
      } while (iVar1 != 0);
    }
  }
  return 0;
}

Assistant:

static BROTLI_BOOL ProcessMetadata(
    BrotliEncoderState* s, size_t* available_in, const uint8_t** next_in,
    size_t* available_out, uint8_t** next_out, size_t* total_out) {
  if (*available_in > (1u << 24)) return BROTLI_FALSE;
  /* Switch to metadata block workflow, if required. */
  if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
    s->remaining_metadata_bytes_ = (uint32_t)*available_in;
    s->stream_state_ = BROTLI_STREAM_METADATA_HEAD;
  }
  if (s->stream_state_ != BROTLI_STREAM_METADATA_HEAD &&
      s->stream_state_ != BROTLI_STREAM_METADATA_BODY) {
    return BROTLI_FALSE;
  }

  while (BROTLI_TRUE) {
    if (InjectFlushOrPushOutput(s, available_out, next_out, total_out)) {
      continue;
    }
    if (s->available_out_ != 0) break;

    if (s->input_pos_ != s->last_flush_pos_) {
      BROTLI_BOOL result = EncodeData(s, BROTLI_FALSE, BROTLI_TRUE,
          &s->available_out_, &s->next_out_);
      if (!result) return BROTLI_FALSE;
      continue;
    }

    if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD) {
      s->next_out_ = s->tiny_buf_.u8;
      s->available_out_ =
          WriteMetadataHeader(s, s->remaining_metadata_bytes_, s->next_out_);
      s->stream_state_ = BROTLI_STREAM_METADATA_BODY;
      continue;
    } else {
      /* Exit workflow only when there is no more input and no more output.
         Otherwise client may continue producing empty metadata blocks. */
      if (s->remaining_metadata_bytes_ == 0) {
        s->remaining_metadata_bytes_ = BROTLI_UINT32_MAX;
        s->stream_state_ = BROTLI_STREAM_PROCESSING;
        break;
      }
      if (*available_out) {
        /* Directly copy input to output. */
        uint32_t copy = (uint32_t)BROTLI_MIN(
            size_t, s->remaining_metadata_bytes_, *available_out);
        memcpy(*next_out, *next_in, copy);
        *next_in += copy;
        *available_in -= copy;
        s->remaining_metadata_bytes_ -= copy;
        *next_out += copy;
        *available_out -= copy;
      } else {
        /* This guarantees progress in "TakeOutput" workflow. */
        uint32_t copy = BROTLI_MIN(uint32_t, s->remaining_metadata_bytes_, 16);
        s->next_out_ = s->tiny_buf_.u8;
        memcpy(s->next_out_, *next_in, copy);
        *next_in += copy;
        *available_in -= copy;
        s->remaining_metadata_bytes_ -= copy;
        s->available_out_ = copy;
      }
      continue;
    }
  }

  return BROTLI_TRUE;
}